

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O0

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::ReadNL
          (SolverApp<TestSolver,_TestNLReader> *this,int nl_reader_flags)

{
  int iVar1;
  TestSolver *s;
  function<void_()> *t;
  type s_00;
  StrictMockProblemBuilder *pb;
  long in_RDI;
  double read_time;
  time_point start;
  int in_stack_00000104;
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *in_stack_00000108;
  TestNLReader *in_stack_00000110;
  undefined1 in_stack_00000118 [16];
  pointer in_stack_ffffffffffffff38;
  function<void_()> *in_stack_ffffffffffffff40;
  function<void_()> *after_h;
  CStringRef arg0;
  BasicCStringRef<char> in_stack_ffffffffffffff90;
  long local_18;
  
  local_18 = std::chrono::_V2::steady_clock::now();
  s = (TestSolver *)operator_new(0x1ca8);
  StrictMockProblemBuilder::StrictMockProblemBuilder
            ((StrictMockProblemBuilder *)in_stack_ffffffffffffff90.data_,s);
  std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::reset
            ((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_> *
             )in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  t = (function<void_()> *)operator_new(0x88);
  after_h = t;
  s_00 = std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::
         operator*((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                    *)in_stack_ffffffffffffff40);
  pb = (StrictMockProblemBuilder *)(in_RDI + 8);
  arg0.data_ = &stack0xffffffffffffffb8;
  std::function<void_()>::function(in_stack_ffffffffffffff40);
  internal::
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  ::SolverNLHandlerImpl
            ((SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
              *)arg0.data_,pb,(TestSolver *)s_00,after_h);
  std::
  unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  ::reset((unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           *)in_stack_ffffffffffffff40,(pointer)in_stack_ffffffffffffff38);
  std::function<void_()>::~function((function<void_()> *)0x2351e5);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffff40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38);
  std::
  unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  ::operator*((unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
               *)in_stack_ffffffffffffff40);
  TestNLReader::
  Read<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>>
            (in_stack_00000110,(StringRef)in_stack_00000118,in_stack_00000108,in_stack_00000104);
  GetTimeAndReset((time_point *)t);
  iVar1 = BasicSolver::timing((BasicSolver *)(in_RDI + 8));
  if (iVar1 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff90,"Input time = {:.6f}s\n");
    BasicSolver::Print<double>((BasicSolver *)pb,arg0,(double *)s_00);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::ReadNL(int nl_reader_flags) {
  std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();

  builder_.reset(new ProblemBuilder(solver_));
  handler_.reset(new internal::SolverNLHandler<Solver>(*builder_, solver_));
  this->Read(nl_filename, *handler_, nl_reader_flags);

  double read_time = GetTimeAndReset(start);
  if (solver_.timing())
    solver_.Print("Input time = {:.6f}s\n", read_time);
}